

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS
fun3d_field_scalar(REF_GRID_conflict ref_grid,REF_INT ldim,REF_DBL *initial_field,char *interpolant,
                  REF_DBL *scalar)

{
  double dVar1;
  double dVar2;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  REF_NODE pRVar9;
  undefined8 uVar10;
  double *pdVar11;
  long lVar12;
  char *pcVar13;
  double dVar14;
  double dVar15;
  REF_DBL RVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  REF_INT solb_ldim;
  REF_DBL *solb_scalar;
  undefined4 local_a8;
  undefined4 local_98;
  int local_7c;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  REF_DBL *local_50;
  double local_48;
  undefined8 uStack_40;
  
  ref_mpi = ref_grid->mpi;
  uVar6 = ref_validation_finite(ref_grid,ldim,initial_field);
  if (uVar6 != 0) {
    pcVar13 = "init field";
    uVar10 = 0x9c0;
    goto LAB_00123e16;
  }
  if (ref_mpi->id == 0) {
    printf("compute %s\n",interpolant);
  }
  iVar7 = strcmp(interpolant,"incomp");
  bVar5 = false;
  if (iVar7 == 0) {
    if (3 < ldim) {
      lVar8 = (long)ref_grid->node->max;
      if (0 < lVar8) {
        pRVar3 = ref_grid->node->global;
        pdVar11 = initial_field + 2;
        lVar12 = 0;
        do {
          if (-1 < pRVar3[lVar12]) {
            scalar[lVar12] =
                 SQRT(*pdVar11 * *pdVar11 + pdVar11[-2] * pdVar11[-2] + pdVar11[-1] * pdVar11[-1]);
          }
          lVar12 = lVar12 + 1;
          pdVar11 = pdVar11 + (uint)ldim;
        } while (lVar8 != lVar12);
      }
      ref_mpi_stopwatch_stop(ref_mpi,"compute incompressible scalar");
      bVar5 = true;
      goto LAB_00123ef5;
    }
    pcVar13 = "expected 4 or more variables per vertex for incompressible";
    uVar10 = 0x9c5;
LAB_0012444b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar10,"fun3d_field_scalar",pcVar13);
  }
  else {
LAB_00123ef5:
    iVar7 = strcmp(interpolant,"space-time");
    if (iVar7 == 0) {
      if (ldim < 4) {
        pcVar13 = "expected 4 or more variables per vertex for space-time";
        uVar10 = 0x9d3;
        goto LAB_0012444b;
      }
      pRVar9 = ref_grid->node;
      if (0 < pRVar9->max) {
        pdVar11 = initial_field + 3;
        lVar8 = 0;
        do {
          if (-1 < pRVar9->global[lVar8]) {
            dVar1 = pdVar11[-3];
            dVar2 = pdVar11[-2];
            dVar15 = pdVar11[-1];
            dVar24 = *pdVar11;
            auVar18._0_8_ = dVar1 * 1e+20;
            auVar18._8_8_ = dVar24;
            auVar22._0_8_ = -auVar18._0_8_;
            auVar22._8_8_ = -dVar24;
            auVar18 = maxpd(auVar18,auVar22);
            local_a8 = SUB84(dVar24,0);
            if (auVar18._0_8_ <= auVar18._8_8_) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x9dc,"fun3d_field_scalar","can not divide by rho");
              printf("rho = %e  u = %e  v = %e  press = %e\n",dVar1,dVar2,dVar15,local_a8);
              return 1;
            }
            dVar14 = (dVar24 / dVar1) * 1.4;
            dVar24 = dVar2 * dVar2 + dVar15 * dVar15;
            auVar23._0_8_ = dVar14 * 1e+20;
            auVar23._8_8_ = dVar24;
            auVar4._8_8_ = -dVar24;
            auVar4._0_8_ = -auVar23._0_8_;
            auVar18 = maxpd(auVar23,auVar4);
            if (auVar18._0_8_ <= auVar18._8_8_) {
              uStack_70 = 0;
              local_78 = dVar14;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x9e2,"fun3d_field_scalar","can not divide by temp");
              pcVar13 = "rho = %e  u = %e  v = %e  press = %e  temp = %e\n";
            }
            else {
              dVar24 = dVar24 / dVar14;
              if (dVar24 >= 0.0) {
                if (dVar24 < 0.0) {
                  RVar16 = sqrt(dVar24);
                }
                else {
                  RVar16 = SQRT(dVar24);
                }
                scalar[lVar8] = RVar16;
                pRVar9 = ref_grid->node;
                goto LAB_001243b0;
              }
              uStack_70 = 0;
              local_78 = dVar14;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x9e7,"fun3d_field_scalar","negative mach2");
              pcVar13 = "rho = %e  u = %e  v = %e press = %e  temp = %e\n";
            }
            local_98 = local_78._0_4_;
            goto LAB_00124744;
          }
LAB_001243b0:
          lVar8 = lVar8 + 1;
          pdVar11 = pdVar11 + (uint)ldim;
        } while (lVar8 < pRVar9->max);
      }
      ref_mpi_stopwatch_stop(ref_mpi,"compute incompressible scalar");
      bVar5 = true;
    }
    iVar7 = strcmp(interpolant,"mach");
    if (((((iVar7 == 0) || (iVar7 = strcmp(interpolant,"htot"), iVar7 == 0)) ||
         (iVar7 = strcmp(interpolant,"ptot"), iVar7 == 0)) ||
        ((iVar7 = strcmp(interpolant,"pressure"), iVar7 == 0 ||
         (iVar7 = strcmp(interpolant,"density"), iVar7 == 0)))) ||
       (iVar7 = strcmp(interpolant,"temperature"), iVar7 == 0)) {
      if (ldim < 5) {
        pcVar13 = "expected 5 or more variables per vertex for compressible";
        uVar10 = 0x9f2;
        goto LAB_0012444b;
      }
      pRVar9 = ref_grid->node;
      if (0 < pRVar9->max) {
        pdVar11 = initial_field + 4;
        lVar8 = 0;
        do {
          if (-1 < pRVar9->global[lVar8]) {
            dVar1 = pdVar11[-4];
            dVar2 = pdVar11[-3];
            dVar15 = pdVar11[-2];
            dVar24 = pdVar11[-1];
            dVar14 = *pdVar11;
            auVar17._0_8_ = dVar1 * 1e+20;
            auVar17._8_8_ = dVar14;
            auVar20._0_8_ = -auVar17._0_8_;
            auVar20._8_8_ = -dVar14;
            auVar18 = maxpd(auVar17,auVar20);
            local_98 = SUB84(dVar14,0);
            local_a8 = SUB84(dVar24,0);
            if (auVar18._0_8_ <= auVar18._8_8_) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x9fd,"fun3d_field_scalar","can not divide by rho");
              pcVar13 = "rho = %e  u = %e  v = %e  w = %e  press = %e\n";
LAB_00124744:
              printf(pcVar13,dVar1,dVar2,dVar15,local_a8,local_98);
              return 1;
            }
            local_68 = (dVar14 / dVar1) * 1.4;
            dVar24 = dVar24 * dVar24 + dVar2 * dVar2 + dVar15 * dVar15;
            auVar19._0_8_ = local_68 * 1e+20;
            auVar19._8_8_ = dVar24;
            auVar21._0_8_ = -auVar19._0_8_;
            auVar21._8_8_ = -dVar24;
            auVar18 = maxpd(auVar19,auVar21);
            uStack_60 = 0;
            if (auVar18._0_8_ <= auVar18._8_8_) {
              pcVar13 = "can not divide by temp";
              uVar10 = 0xa03;
LAB_00124571:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,uVar10,"fun3d_field_scalar",pcVar13);
              printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n",dVar1,dVar2,dVar15,
                     local_a8,local_98,local_68);
              return 1;
            }
            if (dVar24 / local_68 < 0.0) {
              pcVar13 = "negative mach2";
              uVar10 = 0xa08;
              goto LAB_00124571;
            }
            uStack_70 = 0;
            uStack_40 = 0;
            local_78 = dVar24 / local_68;
            local_48 = dVar24;
            iVar7 = strcmp(interpolant,"mach");
            if (iVar7 == 0) {
              if (local_78 < 0.0) {
                dVar14 = sqrt(local_78);
              }
              else {
                dVar14 = SQRT(local_78);
              }
            }
            else {
              iVar7 = strcmp(interpolant,"htot");
              if (iVar7 == 0) {
                dVar14 = local_68 * 2.5000000000000004 + local_48 * 0.5;
              }
              else {
                iVar7 = strcmp(interpolant,"ptot");
                if (iVar7 == 0) {
                  dVar15 = pow(local_78 * 0.19999999999999996 + 1.0,3.5000000000000004);
                  dVar14 = dVar14 * dVar15;
                }
                else {
                  iVar7 = strcmp(interpolant,"pressure");
                  if (((iVar7 != 0) &&
                      (iVar7 = strcmp(interpolant,"density"), dVar14 = dVar1, iVar7 != 0)) &&
                     (iVar7 = strcmp(interpolant,"temperature"), dVar14 = local_68, iVar7 != 0))
                  goto LAB_0012422d;
                }
              }
            }
            scalar[lVar8] = dVar14;
            bVar5 = true;
          }
LAB_0012422d:
          lVar8 = lVar8 + 1;
          pRVar9 = ref_grid->node;
          pdVar11 = pdVar11 + (uint)ldim;
        } while (lVar8 < pRVar9->max);
      }
      if (bVar5) {
        pcVar13 = "compute compressible scalar";
        goto LAB_00124256;
      }
    }
    else if (bVar5) {
      return 0;
    }
    if (ref_mpi->id == 0) {
      printf("opening %s as solb multiscale interpolant\n",interpolant);
    }
    uVar6 = ref_part_scalar(ref_grid,&local_7c,&local_50,interpolant);
    if (uVar6 != 0) {
      pcVar13 = "unable to load interpolant scalar";
      uVar10 = 0xa28;
LAB_00123e16:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar10,"fun3d_field_scalar",(ulong)uVar6,pcVar13);
      return uVar6;
    }
    if ((long)local_7c == 1) {
      lVar8 = (long)ref_grid->node->max;
      if (0 < lVar8) {
        pRVar3 = ref_grid->node->global;
        lVar12 = 0;
        do {
          if (-1 < pRVar3[lVar12]) {
            scalar[lVar12] = local_50[lVar12];
          }
          lVar12 = lVar12 + 1;
        } while (lVar8 != lVar12);
      }
      if (local_50 != (REF_DBL *)0x0) {
        free(local_50);
      }
      pcVar13 = "read interpolant from file";
LAB_00124256:
      ref_mpi_stopwatch_stop(ref_mpi,pcVar13);
      return 0;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xa29,"fun3d_field_scalar","expected one interpolant scalar",1,(long)local_7c);
  }
  return 1;
}

Assistant:

static REF_STATUS fun3d_field_scalar(REF_GRID ref_grid, REF_INT ldim,
                                     REF_DBL *initial_field,
                                     const char *interpolant, REF_DBL *scalar) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_DBL gamma = 1.4;
  REF_BOOL recognized = REF_FALSE;

  RSS(ref_validation_finite(ref_grid, ldim, initial_field), "init field");
  if (ref_mpi_once(ref_mpi)) printf("compute %s\n", interpolant);
  if (strcmp(interpolant, "incomp") == 0) {
    recognized = REF_TRUE;
    RAS(4 <= ldim,
        "expected 4 or more variables per vertex for incompressible");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL u, v, w, u2;
      u = initial_field[0 + ldim * node];
      v = initial_field[1 + ldim * node];
      w = initial_field[2 + ldim * node];
      /* press = initial_field[3 + ldim * node]; */
      u2 = u * u + v * v + w * w;
      scalar[node] = sqrt(u2);
    }
    ref_mpi_stopwatch_stop(ref_mpi, "compute incompressible scalar");
  }
  if (strcmp(interpolant, "space-time") == 0) {
    recognized = REF_TRUE;
    RAS(4 <= ldim, "expected 4 or more variables per vertex for space-time");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL rho, u, v, press, temp, u2, mach2;
      rho = initial_field[0 + ldim * node];
      u = initial_field[1 + ldim * node];
      v = initial_field[2 + ldim * node];
      press = initial_field[3 + ldim * node];
      RAB(ref_math_divisible(press, rho), "can not divide by rho", {
        printf("rho = %e  u = %e  v = %e  press = %e\n", rho, u, v, press);
      });
      temp = gamma * (press / rho);
      u2 = u * u + v * v;
      RAB(ref_math_divisible(u2, temp), "can not divide by temp", {
        printf("rho = %e  u = %e  v = %e  press = %e  temp = %e\n", rho, u, v,
               press, temp);
      });
      mach2 = u2 / temp;
      RAB(mach2 >= 0, "negative mach2", {
        printf("rho = %e  u = %e  v = %e press = %e  temp = %e\n", rho, u, v,
               press, temp);
      });
      scalar[node] = sqrt(mach2);
    }
    ref_mpi_stopwatch_stop(ref_mpi, "compute incompressible scalar");
  }
  if ((strcmp(interpolant, "mach") == 0) ||
      (strcmp(interpolant, "htot") == 0) ||
      (strcmp(interpolant, "ptot") == 0) ||
      (strcmp(interpolant, "pressure") == 0) ||
      (strcmp(interpolant, "density") == 0) ||
      (strcmp(interpolant, "temperature") == 0)) {
    RAS(5 <= ldim, "expected 5 or more variables per vertex for compressible");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL rho, u, v, w, press, temp, u2, mach2;
      rho = initial_field[0 + ldim * node];
      u = initial_field[1 + ldim * node];
      v = initial_field[2 + ldim * node];
      w = initial_field[3 + ldim * node];
      press = initial_field[4 + ldim * node];
      RAB(ref_math_divisible(press, rho), "can not divide by rho", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e\n", rho, u, v, w,
               press);
      });
      temp = gamma * (press / rho);
      u2 = u * u + v * v + w * w;
      RAB(ref_math_divisible(u2, temp), "can not divide by temp", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n", rho,
               u, v, w, press, temp);
      });
      mach2 = u2 / temp;
      RAB(mach2 >= 0, "negative mach2", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n", rho,
               u, v, w, press, temp);
      });
      if (strcmp(interpolant, "mach") == 0) {
        recognized = REF_TRUE;
        scalar[node] = sqrt(mach2);
      } else if (strcmp(interpolant, "htot") == 0) {
        recognized = REF_TRUE;
        scalar[node] = temp * (1.0 / (gamma - 1.0)) + 0.5 * u2;
      } else if (strcmp(interpolant, "ptot") == 0) {
        recognized = REF_TRUE;
        scalar[node] =
            press * pow(1.0 + 0.5 * (gamma - 1.0) * mach2, gamma / (gamma - 1));
      } else if (strcmp(interpolant, "pressure") == 0) {
        recognized = REF_TRUE;
        scalar[node] = press;
      } else if (strcmp(interpolant, "density") == 0) {
        recognized = REF_TRUE;
        scalar[node] = rho;
      } else if (strcmp(interpolant, "temperature") == 0) {
        recognized = REF_TRUE;
        scalar[node] = temp;
      }
    }
    if (recognized)
      ref_mpi_stopwatch_stop(ref_mpi, "compute compressible scalar");
  }

  if (!recognized) {
    REF_INT solb_ldim;
    REF_DBL *solb_scalar;
    if (ref_mpi_once(ref_mpi))
      printf("opening %s as solb multiscale interpolant\n", interpolant);
    RSS(ref_part_scalar(ref_grid, &solb_ldim, &solb_scalar, interpolant),
        "unable to load interpolant scalar");
    REIS(1, solb_ldim, "expected one interpolant scalar");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      scalar[node] = solb_scalar[node];
    }
    ref_free(solb_scalar);
    ref_mpi_stopwatch_stop(ref_mpi, "read interpolant from file");
  }

  return REF_SUCCESS;
}